

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O0

hrgls_Status __thiscall
hrgls::API::SetLogMessageCallback(API *this,LogMessageCallback callback,void *userdata)

{
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> lock2;
  lock_guard<std::mutex> lock;
  void *userdata_local;
  LogMessageCallback callback_local;
  API *this_local;
  
  if (this->m_private == (API_private *)0x0) {
    this_local._4_4_ = 0x3ee;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(&lock2,&this->m_private->callbackMutex);
    this->m_private->callbackHandler = callback;
    this->m_private->callbackUserData = userdata;
    std::lock_guard<std::mutex>::~lock_guard(&lock2);
    std::lock_guard<std::mutex>::lock_guard(&local_38,&this->m_private->storedMessagesMutex);
    std::__cxx11::list<hrgls::Message,_std::allocator<hrgls::Message>_>::clear
              (&this->m_private->storedMessages);
    this_local._4_4_ = 0;
    std::lock_guard<std::mutex>::~lock_guard(&local_38);
  }
  return this_local._4_4_;
}

Assistant:

hrgls_Status API::SetLogMessageCallback(LogMessageCallback callback,
      void *userdata)
  {
      if (!m_private) {
          return hrgls_STATUS_NULL_OBJECT_POINTER;
      }

      // Lock the thread mutices for callback and streaming while we change
      // the state.
      {
        std::lock_guard<std::mutex> lock(m_private->callbackMutex);

        // Set the streaming callback handler.
        m_private->callbackHandler = callback;
        m_private->callbackUserData = userdata;
      }

      // Flush all stored messages.
      std::lock_guard<std::mutex> lock2(m_private->storedMessagesMutex);
      m_private->storedMessages.clear();

      return hrgls_STATUS_OKAY;
  }